

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterResult __thiscall
duckdb::FilterCombiner::AddBoundComparisonFilter(FilterCombiner *this,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ClientContext *context;
  _Base_ptr p_Var1;
  ExpressionValueInformation *pEVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FilterResult FVar7;
  FilterResult FVar8;
  BoundComparisonExpression *pBVar9;
  pointer pEVar10;
  type pEVar11;
  Expression *expr_00;
  Expression *expr_01;
  idx_t iVar12;
  iterator iVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  iterator iVar17;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar18;
  FilterCombiner *this_01;
  FilterCombiner *pFVar19;
  char cVar20;
  reference_wrapper<duckdb::Expression> *right_expr;
  _Base_ptr __k;
  ExpressionValueInformation *pEVar21;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  undefined1 local_180 [24];
  idx_t equivalence_set;
  idx_t right_equivalence_set;
  bool local_148;
  idx_t left_equivalence_set;
  ExpressionType local_e0;
  LogicalType local_d8;
  undefined1 local_c0 [144];
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&expr->super_BaseExpression);
  FVar7 = UNSUPPORTED;
  if ((byte)((pBVar9->super_Expression).super_BaseExpression.type - COMPARE_BOUNDARY_START) < 6) {
    this_02 = &pBVar9->left;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_02);
    iVar5 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
    this_00 = &pBVar9->right;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    iVar6 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
    cVar20 = (char)iVar5;
    if ((cVar20 == '\0') && ((char)iVar6 == '\0')) {
      if ((expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_02);
        expr_00 = GetNode(this,pEVar11);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_00);
        expr_01 = GetNode(this,pEVar11);
        iVar5 = (*(expr_00->super_BaseExpression)._vptr_BaseExpression[10])(expr_00,expr_01);
        if ((char)iVar5 == '\0') {
          iVar12 = GetEquivalenceSet(this,expr_00);
          left_equivalence_set = iVar12;
          right_equivalence_set = GetEquivalenceSet(this,expr_01);
          if (iVar12 == right_equivalence_set) {
LAB_01257050:
            FVar7 = SUCCESS;
          }
          else {
            iVar13 = ::std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
                     ::find(&(this->equivalence_map)._M_t,&left_equivalence_set);
            iVar14 = ::std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
                     ::find(&(this->equivalence_map)._M_t,&right_equivalence_set);
            p_Var1 = iVar14._M_node[1]._M_left;
            for (__k = iVar14._M_node[1]._M_parent; iVar12 = left_equivalence_set, __k != p_Var1;
                __k = (_Base_ptr)&__k->_M_parent) {
              pmVar15 = ::std::__detail::
                        _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->equivalence_set_map,(key_type *)__k);
              *pmVar15 = iVar12;
              ::std::
              vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
              ::push_back((vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                           *)&iVar13._M_node[1]._M_parent,(value_type *)__k);
            }
            iVar16 = ::std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                     ::find(&(this->constant_values)._M_t,&left_equivalence_set);
            iVar17 = ::std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                     ::find(&(this->constant_values)._M_t,&right_equivalence_set);
            pEVar21 = (ExpressionValueInformation *)iVar17._M_node[1]._M_parent;
            pEVar2 = (ExpressionValueInformation *)iVar17._M_node[1]._M_left;
            pFVar19 = (FilterCombiner *)(local_c0 + 0x48);
            do {
              if (pEVar21 == pEVar2) goto LAB_01257050;
              this_01 = pFVar19;
              ExpressionValueInformation::ExpressionValueInformation
                        ((ExpressionValueInformation *)pFVar19,pEVar21);
              FVar7 = AddConstantComparison
                                (this_01,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                          *)&iVar16._M_node[1]._M_parent,
                                 (ExpressionValueInformation *)pFVar19);
              Value::~Value((Value *)pFVar19);
              pEVar21 = pEVar21 + 1;
            } while (FVar7 != UNSATISFIABLE);
            FVar7 = UNSATISFIABLE;
          }
        }
      }
    }
    else {
      puVar18 = this_02;
      if (cVar20 != '\0') {
        puVar18 = this_00;
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar18);
      local_180._16_8_ = GetNode(this,pEVar11);
      equivalence_set = GetEquivalenceSet(this,(Expression *)local_180._16_8_);
      LogicalType::LogicalType(&local_d8,SQLNULL);
      Value::Value((Value *)&right_equivalence_set,&local_d8);
      puVar18 = this_00;
      if (cVar20 != '\0') {
        puVar18 = this_02;
      }
      local_180._8_8_ = this_00;
      LogicalType::~LogicalType(&local_d8);
      context = this->context;
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar18);
      bVar4 = ExpressionExecutor::TryEvaluateScalar(context,pEVar11,(Value *)&right_equivalence_set)
      ;
      if (bVar4) {
        FVar7 = UNSATISFIABLE;
        if (local_148 == false) {
          ExpressionValueInformation::ExpressionValueInformation
                    ((ExpressionValueInformation *)&left_equivalence_set);
          uVar3 = local_180._8_8_;
          local_e0 = (pBVar9->super_Expression).super_BaseExpression.type;
          if (cVar20 != '\0') {
            local_e0 = FlipComparisonExpression(local_e0);
          }
          Value::operator=((Value *)&left_equivalence_set,(Value *)&right_equivalence_set);
          iVar16 = ::std::
                   _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                   ::find(&(this->constant_values)._M_t,&equivalence_set);
          bVar4 = LogicalType::operator!=
                            ((LogicalType *)(local_180._16_8_ + 0x38),
                             (LogicalType *)&left_equivalence_set);
          if (bVar4) {
            FVar7 = UNSUPPORTED;
          }
          else {
            pFVar19 = (FilterCombiner *)local_c0;
            ExpressionValueInformation::ExpressionValueInformation
                      ((ExpressionValueInformation *)pFVar19,
                       (ExpressionValueInformation *)&left_equivalence_set);
            FVar7 = AddConstantComparison
                              (pFVar19,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                        *)&iVar16._M_node[1]._M_parent,
                               (ExpressionValueInformation *)local_c0);
            Value::~Value((Value *)local_c0);
            if (cVar20 != '\0') {
              this_02 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)uVar3;
            }
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (this_02);
            FindTransitiveFilter((FilterCombiner *)local_180,(Expression *)this);
            if ((ClientContext *)local_180._0_8_ != (ClientContext *)0x0) {
              pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)local_180);
              pBVar9 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                                 (&pEVar10->super_BaseExpression);
              FVar8 = AddTransitiveFilters(this,pBVar9,true);
              if (FVar8 == UNSATISFIABLE) {
                FVar7 = UNSATISFIABLE;
              }
              else if (FVar8 == UNSUPPORTED) {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&this->remaining_filters,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_180);
              }
            }
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_180._0_8_ != (Expression *)0x0) {
              (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_180._0_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                        internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)();
            }
          }
          Value::~Value((Value *)&left_equivalence_set);
        }
      }
      else {
        FVar7 = UNSUPPORTED;
      }
      Value::~Value((Value *)&right_equivalence_set);
    }
  }
  return FVar7;
}

Assistant:

FilterResult FilterCombiner::AddBoundComparisonFilter(Expression &expr) {
	auto &comparison = expr.Cast<BoundComparisonExpression>();
	if (!SupportedFilterComparison(comparison.GetExpressionType())) {
		// only support [>, >=, <, <=, ==, !=] expressions
		return FilterResult::UNSUPPORTED;
	}
	// check if one of the sides is a scalar value
	bool left_is_scalar = comparison.left->IsFoldable();
	bool right_is_scalar = comparison.right->IsFoldable();
	if (left_is_scalar || right_is_scalar) {
		// comparison with scalar
		auto &node = GetNode(left_is_scalar ? *comparison.right : *comparison.left);
		idx_t equivalence_set = GetEquivalenceSet(node);
		auto &scalar = left_is_scalar ? comparison.left : comparison.right;
		Value constant_value;
		if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
			return FilterResult::UNSUPPORTED;
		}
		if (constant_value.IsNull()) {
			// comparisons with null are always null (i.e. will never result in rows)
			return FilterResult::UNSATISFIABLE;
		}

		// create the ExpressionValueInformation
		ExpressionValueInformation info;
		info.comparison_type =
		    left_is_scalar ? FlipComparisonExpression(comparison.GetExpressionType()) : comparison.GetExpressionType();
		info.constant = constant_value;

		// get the current bucket of constant values
		D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
		auto &info_list = constant_values.find(equivalence_set)->second;
		if (node.return_type != info.constant.type()) {
			return FilterResult::UNSUPPORTED;
		}
		// check the existing constant comparisons to see if we can do any pruning
		auto ret = AddConstantComparison(info_list, info);

		auto &non_scalar = left_is_scalar ? *comparison.right : *comparison.left;
		auto transitive_filter = FindTransitiveFilter(non_scalar);
		if (transitive_filter != nullptr) {
			// try to add transitive filters
			auto transitive_result = AddTransitiveFilters(transitive_filter->Cast<BoundComparisonExpression>());
			if (transitive_result == FilterResult::UNSUPPORTED) {
				// in case of unsuccessful re-add filter into remaining ones
				remaining_filters.push_back(std::move(transitive_filter));
			}
			if (transitive_result == FilterResult::UNSATISFIABLE) {
				// in case transitive filter is unsatisfiable - abort filter pushdown
				return FilterResult::UNSATISFIABLE;
			}
		}
		return ret;
	} else {
		// comparison between two non-scalars
		// only handle comparisons for now
		if (expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
			return FilterResult::UNSUPPORTED;
		}
		// get the LHS and RHS nodes
		auto &left_node = GetNode(*comparison.left);
		auto &right_node = GetNode(*comparison.right);
		if (left_node.Equals(right_node)) {
			return FilterResult::UNSUPPORTED;
		}
		// get the equivalence sets of the LHS and RHS
		auto left_equivalence_set = GetEquivalenceSet(left_node);
		auto right_equivalence_set = GetEquivalenceSet(right_node);
		if (left_equivalence_set == right_equivalence_set) {
			// this equality filter already exists, prune it
			return FilterResult::SUCCESS;
		}
		// add the right bucket into the left bucket
		D_ASSERT(equivalence_map.find(left_equivalence_set) != equivalence_map.end());
		D_ASSERT(equivalence_map.find(right_equivalence_set) != equivalence_map.end());

		auto &left_bucket = equivalence_map.find(left_equivalence_set)->second;
		auto &right_bucket = equivalence_map.find(right_equivalence_set)->second;
		for (auto &right_expr : right_bucket) {
			// rewrite the equivalence set mapping for this node
			equivalence_set_map[right_expr] = left_equivalence_set;
			// add the node to the left bucket
			left_bucket.push_back(right_expr);
		}
		// now add all constant values from the right bucket to the left bucket
		D_ASSERT(constant_values.find(left_equivalence_set) != constant_values.end());
		D_ASSERT(constant_values.find(right_equivalence_set) != constant_values.end());
		auto &left_constant_bucket = constant_values.find(left_equivalence_set)->second;
		auto &right_constant_bucket = constant_values.find(right_equivalence_set)->second;
		for (auto &right_constant : right_constant_bucket) {
			if (AddConstantComparison(left_constant_bucket, right_constant) == FilterResult::UNSATISFIABLE) {
				return FilterResult::UNSATISFIABLE;
			}
		}
	}
	return FilterResult::SUCCESS;
}